

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O3

pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
* __thiscall
QFlatMap<QPushButton*,QDialogButtonBox::StandardButton,std::less<QPushButton*>,QVarLengthArray<QPushButton*,8ll>,QVarLengthArray<QDialogButtonBox::StandardButton,8ll>>
::try_emplace<QDialogButtonBox::StandardButton_const&>
          (pair<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,QPushButton **key,StandardButton *args)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  
  cVar4 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
          ::lower_bound((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                         *)this,key);
  lVar3 = cVar4.i;
  if ((lVar3 == *(long *)((long)this + 8)) ||
     (*key < *(QPushButton **)(*(long *)((long)this + 0x10) + lVar3 * 8))) {
    QVLABase<QDialogButtonBox::StandardButton>::
    emplace_back_impl<QDialogButtonBox::StandardButton_const&>
              ((QVLABase<QDialogButtonBox::StandardButton> *)((long)this + 0x58),8,
               (void *)((long)this + 0x70),args);
    lVar1 = *(long *)((long)this + 0x68);
    std::_V2::__rotate<unsigned_char*>
              (lVar1 + lVar3 * 4,lVar1 + *(long *)((long)this + 0x60) * 4 + -4,
               lVar1 + *(long *)((long)this + 0x60) * 4);
    QVLABase<QPushButton_*>::resize_impl
              ((QVLABase<QPushButton_*> *)this,8,(void *)((long)this + 0x18),
               *(long *)((long)this + 8) + 1,key);
    lVar1 = *(long *)((long)this + 0x10);
    lVar3 = lVar1 + lVar3 * 8;
    std::_V2::__rotate<unsigned_char*>
              (lVar3,lVar1 + *(long *)((long)this + 8) * 8 + -8,
               lVar1 + *(long *)((long)this + 8) * 8);
    lVar3 = lVar3 - *(long *)((long)this + 0x10) >> 3;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  (__return_storage_ptr__->first).c = (containers *)this;
  (__return_storage_ptr__->first).i = lVar3;
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }